

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O0

void ihevc_sao_edge_offset_class2
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  char cVar1;
  int iVar2;
  undefined1 *puVar3;
  undefined1 uVar4;
  char cVar5;
  uint uVar6;
  byte *pbVar7;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  byte *in_RDI;
  byte *in_R8;
  char *in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  WORD8 *pu1_swap_tmp;
  WORD32 edge_idx_2;
  WORD32 edge_idx_1;
  WORD32 edge_idx;
  UWORD8 u1_pos_wd_ht_tmp;
  UWORD8 u1_pos_0_0_tmp;
  WORD32 bit_depth;
  UWORD8 *pu1_src_left_cpy;
  WORD8 *pu1_sign_up_tmp;
  WORD8 *pu1_sign_up;
  WORD8 u1_sign_down;
  WORD8 au1_sign_up_tmp [65];
  WORD8 au1_sign_up [65];
  UWORD8 u1_src_top_left_tmp;
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_src_left_tmp [64];
  UWORD8 au1_mask [64];
  WORD32 col;
  WORD32 row;
  int local_238;
  int local_228;
  byte local_214;
  byte local_1fc;
  uint local_1f8;
  uint local_1f0;
  byte local_1e8;
  uint local_1e4;
  uint local_1dc;
  byte local_1be;
  byte local_1bd;
  long local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 local_198 [80];
  undefined1 local_148 [79];
  byte local_f9;
  byte abStack_f8 [64];
  byte abStack_b8 [64];
  byte local_78 [64];
  int local_38;
  int local_34;
  byte *local_28;
  long local_20;
  long local_18;
  int local_c;
  byte *local_8;
  
  local_1b0 = local_198;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_78,0xff,0x40);
  local_f9 = *(byte *)(local_20 + (in_stack_00000020 + -1));
  for (local_34 = 0; local_34 < in_stack_00000028; local_34 = local_34 + 1) {
    abStack_b8[local_34] = local_8[local_34 * local_c + in_stack_00000020 + -1];
  }
  for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
    abStack_f8[local_38] = local_8[(in_stack_00000028 + -1) * local_c + local_38];
  }
  if (in_stack_00000010[4] == '\0') {
    local_1bd = *local_8;
  }
  else {
    if ((int)((uint)*local_8 - (uint)*local_28) < 0) {
      local_1dc = 0xffffffff;
    }
    else {
      local_1dc = (uint)(0 < (int)((uint)*local_8 - (uint)*local_28));
    }
    if ((int)((uint)*local_8 - (uint)local_8[local_c + 1]) < 0) {
      local_1e4 = 0xffffffff;
    }
    else {
      local_1e4 = (uint)(0 < (int)((uint)*local_8 - (uint)local_8[local_c + 1]));
    }
    iVar2 = gi4_ihevc_table_edge_idx[(int)(local_1dc + 2 + local_1e4)];
    if (iVar2 == 0) {
      local_1bd = *local_8;
    }
    else {
      if ((int)((uint)*local_8 + (int)*(char *)(in_stack_00000018 + iVar2)) < 0x100) {
        if ((int)((uint)*local_8 + (int)*(char *)(in_stack_00000018 + iVar2)) < 0) {
          local_1e8 = 0;
        }
        else {
          local_1e8 = *local_8 + *(char *)(in_stack_00000018 + iVar2);
        }
      }
      else {
        local_1e8 = 0xff;
      }
      local_1bd = local_1e8;
    }
  }
  if (in_stack_00000010[7] == '\0') {
    local_1be = local_8[in_stack_00000020 + -1 + (in_stack_00000028 + -1) * local_c];
  }
  else {
    if ((int)((uint)local_8[in_stack_00000020 + -1 + (in_stack_00000028 + -1) * local_c] -
             (uint)local_8[(in_stack_00000020 + (in_stack_00000028 + -1) * local_c + -2) - local_c])
        < 0) {
      local_1f0 = 0xffffffff;
    }
    else {
      local_1f0 = (uint)(0 < (int)((uint)local_8[in_stack_00000020 + -1 +
                                                 (in_stack_00000028 + -1) * local_c] -
                                  (uint)local_8[(in_stack_00000020 +
                                                 (in_stack_00000028 + -1) * local_c + -2) - local_c]
                                  ));
    }
    if ((int)((uint)local_8[in_stack_00000020 + -1 + (in_stack_00000028 + -1) * local_c] -
             (uint)local_8[in_stack_00000020 + (in_stack_00000028 + -1) * local_c + local_c]) < 0) {
      local_1f8 = 0xffffffff;
    }
    else {
      local_1f8 = (uint)(0 < (int)((uint)local_8[in_stack_00000020 + -1 +
                                                 (in_stack_00000028 + -1) * local_c] -
                                  (uint)local_8[in_stack_00000020 +
                                                (in_stack_00000028 + -1) * local_c + local_c]));
    }
    iVar2 = gi4_ihevc_table_edge_idx[(int)(local_1f0 + 2 + local_1f8)];
    if (iVar2 == 0) {
      local_1be = local_8[in_stack_00000020 + -1 + (in_stack_00000028 + -1) * local_c];
    }
    else {
      if ((int)((uint)local_8[in_stack_00000020 + -1 + (in_stack_00000028 + -1) * local_c] +
               (int)*(char *)(in_stack_00000018 + iVar2)) < 0x100) {
        if ((int)((uint)local_8[in_stack_00000020 + -1 + (in_stack_00000028 + -1) * local_c] +
                 (int)*(char *)(in_stack_00000018 + iVar2)) < 0) {
          local_1fc = 0;
        }
        else {
          local_1fc = local_8[in_stack_00000020 + -1 + (in_stack_00000028 + -1) * local_c] +
                      *(char *)(in_stack_00000018 + iVar2);
        }
      }
      else {
        local_1fc = 0xff;
      }
      local_1be = local_1fc;
    }
  }
  if (*in_stack_00000010 == '\0') {
    local_78[0] = 0;
  }
  if (in_stack_00000010[2] == '\0') {
    pbVar7 = local_8 + local_c;
    local_8 = pbVar7;
    in_stack_00000028 = in_stack_00000028 + -1;
    local_1b8 = in_RDX + 1;
    for (local_38 = 1; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
      if ((int)((uint)pbVar7[local_38] - (uint)pbVar7[(local_38 + -1) - local_c]) < 0) {
        uVar4 = 0xff;
      }
      else {
        uVar4 = 0 < (int)((uint)pbVar7[local_38] - (uint)pbVar7[(local_38 + -1) - local_c]);
      }
      local_148[local_38] = uVar4;
    }
  }
  else {
    for (local_38 = 1; local_1b8 = in_RDX, local_38 < in_stack_00000020; local_38 = local_38 + 1) {
      if ((int)((uint)local_8[local_38] - (uint)*(byte *)(local_20 + (local_38 + -1))) < 0) {
        uVar4 = 0xff;
      }
      else {
        uVar4 = 0 < (int)((uint)local_8[local_38] - (uint)*(byte *)(local_20 + (local_38 + -1)));
      }
      local_148[local_38] = uVar4;
    }
  }
  if (in_stack_00000010[1] == '\0') {
    local_78[in_stack_00000020 + -1] = 0;
  }
  if (in_stack_00000010[3] == '\0') {
    in_stack_00000028 = in_stack_00000028 + -1;
  }
  local_1a8 = local_148;
  for (local_34 = 0; local_34 < in_stack_00000028; local_34 = local_34 + 1) {
    if ((int)((uint)*local_8 - (uint)*(byte *)(local_1b8 + (local_34 + -1))) < 0) {
      uVar4 = 0xff;
    }
    else {
      uVar4 = 0 < (int)((uint)*local_8 - (uint)*(byte *)(local_1b8 + (local_34 + -1)));
    }
    *local_1a8 = uVar4;
    for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
      if ((int)((uint)local_8[local_38] - (uint)local_8[local_38 + 1 + local_c]) < 0) {
        cVar5 = -1;
      }
      else {
        cVar5 = 0 < (int)((uint)local_8[local_38] - (uint)local_8[local_38 + 1 + local_c]);
      }
      cVar1 = local_1a8[local_38];
      local_1b0[local_38 + 1] = -cVar5;
      uVar6 = gi4_ihevc_table_edge_idx[cVar1 + 2 + (int)cVar5] & (uint)local_78[local_38];
      if (uVar6 != 0) {
        if ((int)((uint)local_8[local_38] + (int)*(char *)(in_stack_00000018 + (int)uVar6)) < 0x100)
        {
          if ((int)((uint)local_8[local_38] + (int)*(char *)(in_stack_00000018 + (int)uVar6)) < 0) {
            local_214 = 0;
          }
          else {
            local_214 = local_8[local_38] + *(char *)(in_stack_00000018 + (int)uVar6);
          }
        }
        else {
          local_214 = 0xff;
        }
        local_8[local_38] = local_214;
      }
    }
    puVar3 = local_1b0;
    local_1b0 = local_1a8;
    local_8 = local_8 + local_c;
    local_1a8 = puVar3;
  }
  if (in_stack_00000010[2] == '\0') {
    local_228 = in_stack_00000028 + 1;
  }
  else {
    local_228 = in_stack_00000028;
  }
  local_8[-local_228 * local_c] = local_1bd;
  if (in_stack_00000010[3] == '\0') {
    local_238 = in_stack_00000020 + -1;
  }
  else {
    local_238 = (in_stack_00000020 + -1) - local_c;
  }
  local_8[local_238] = local_1be;
  if (in_stack_00000010[2] == '\0') {
    in_stack_00000028 = in_stack_00000028 + 1;
  }
  if (in_stack_00000010[3] == '\0') {
    in_stack_00000028 = in_stack_00000028 + 1;
  }
  *local_28 = local_f9;
  for (local_34 = 0; local_34 < in_stack_00000028; local_34 = local_34 + 1) {
    *(byte *)(local_18 + local_34) = abStack_b8[local_34];
  }
  for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
    *(byte *)(local_20 + local_38) = abStack_f8[local_38];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class2(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE], au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 u1_src_top_left_tmp;
    WORD8 au1_sign_up[MAX_CTB_SIZE + 1], au1_sign_up_tmp[MAX_CTB_SIZE + 1];
    WORD8 u1_sign_down;
    WORD8 *pu1_sign_up;
    WORD8 *pu1_sign_up_tmp;
    UWORD8 *pu1_src_left_cpy;

    WORD32 bit_depth;
    UWORD8 u1_pos_0_0_tmp;
    UWORD8 u1_pos_wd_ht_tmp;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);

    bit_depth = BIT_DEPTH_LUMA;
    pu1_sign_up = au1_sign_up;
    pu1_sign_up_tmp = au1_sign_up_tmp;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    u1_src_top_left_tmp = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    /* If top-left is available, process separately */
    if(0 != pu1_avail[4])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[0] - pu1_src_top_left[0]) +
                        SIGN(pu1_src[0] - pu1_src[1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_0_tmp = CLIP3(pu1_src[0] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_0_tmp = pu1_src[0];
        }
    }
    else
    {
        u1_pos_0_0_tmp = pu1_src[0];
    }

    /* If bottom-right is available, process separately */
    if(0 != pu1_avail[7])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[wd - 1 + (ht - 1) * src_strd] - pu1_src[wd - 1 + (ht - 1) * src_strd - 1 - src_strd]) +
                        SIGN(pu1_src[wd - 1 + (ht - 1) * src_strd] - pu1_src[wd - 1 + (ht - 1) * src_strd + 1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_ht_tmp = CLIP3(pu1_src[wd - 1 + (ht - 1) * src_strd] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_ht_tmp = pu1_src[wd - 1 + (ht - 1) * src_strd];
        }
    }
    else
    {
        u1_pos_wd_ht_tmp = pu1_src[wd - 1 + (ht - 1) * src_strd];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 1;
        for(col = 1; col < wd; col++)
        {
            pu1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col - 1 - src_strd]);
        }
    }
    else
    {
        for(col = 1; col < wd; col++)
        {
            pu1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col - 1]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            pu1_sign_up[0] = SIGN(pu1_src[0] - pu1_src_left_cpy[row - 1]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - pu1_src[col + 1 + src_strd]);
                edge_idx = 2 + pu1_sign_up[col] + u1_sign_down;
                pu1_sign_up_tmp[col + 1] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            /* Swapping pu1_sign_up_tmp and pu1_sign_up */
            {
                WORD8 *pu1_swap_tmp = pu1_sign_up;
                pu1_sign_up = pu1_sign_up_tmp;
                pu1_sign_up_tmp = pu1_swap_tmp;
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd] = u1_pos_0_0_tmp;
        pu1_src[(pu1_avail[3] ? wd - 1 - src_strd : wd - 1)] = u1_pos_wd_ht_tmp;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    *pu1_src_top_left = u1_src_top_left_tmp;
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}